

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CropResizeLayerParams::CropResizeLayerParams
          (CropResizeLayerParams *this,CropResizeLayerParams *from)

{
  bool bVar1;
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  CropResizeLayerParams *from_local;
  CropResizeLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CropResizeLayerParams_006f4748;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->targetsize_,&from->targetsize_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_mode(from);
  if (bVar1) {
    this_00 = (SamplingMode *)operator_new(0x18);
    SamplingMode::SamplingMode(this_00,from->mode_);
    this->mode_ = this_00;
  }
  else {
    this->mode_ = (SamplingMode *)0x0;
  }
  bVar1 = _internal_has_boxindicesmode(from);
  if (bVar1) {
    this_01 = (BoxCoordinatesMode *)operator_new(0x18);
    BoxCoordinatesMode::BoxCoordinatesMode(this_01,from->boxindicesmode_);
    this->boxindicesmode_ = this_01;
  }
  else {
    this->boxindicesmode_ = (BoxCoordinatesMode *)0x0;
  }
  memcpy(&this->normalizedcoordinates_,&from->normalizedcoordinates_,8);
  return;
}

Assistant:

CropResizeLayerParams::CropResizeLayerParams(const CropResizeLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      targetsize_(from.targetsize_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_mode()) {
    mode_ = new ::CoreML::Specification::SamplingMode(*from.mode_);
  } else {
    mode_ = nullptr;
  }
  if (from._internal_has_boxindicesmode()) {
    boxindicesmode_ = new ::CoreML::Specification::BoxCoordinatesMode(*from.boxindicesmode_);
  } else {
    boxindicesmode_ = nullptr;
  }
  ::memcpy(&normalizedcoordinates_, &from.normalizedcoordinates_,
    static_cast<size_t>(reinterpret_cast<char*>(&spatialscale_) -
    reinterpret_cast<char*>(&normalizedcoordinates_)) + sizeof(spatialscale_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CropResizeLayerParams)
}